

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

TiXmlNode * __thiscall despot::util::tinyxml::TiXmlUnknown::Clone(TiXmlUnknown *this)

{
  TiXmlNode *pTVar1;
  size_t len;
  char *__s;
  
  pTVar1 = (TiXmlNode *)operator_new(0x50);
  (pTVar1->super_TiXmlBase).location.row = -1;
  (pTVar1->super_TiXmlBase).location.col = -1;
  (pTVar1->super_TiXmlBase).userData = (void *)0x0;
  pTVar1->parent = (TiXmlNode *)0x0;
  (pTVar1->value).rep_ = (Rep *)&TiXmlString::nullrep_;
  pTVar1->type = UNKNOWN;
  pTVar1->firstChild = (TiXmlNode *)0x0;
  pTVar1->lastChild = (TiXmlNode *)0x0;
  pTVar1->prev = (TiXmlNode *)0x0;
  pTVar1->next = (TiXmlNode *)0x0;
  (pTVar1->super_TiXmlBase)._vptr_TiXmlBase = (_func_int **)&PTR__TiXmlNode_00191798;
  __s = ((this->super_TiXmlNode).value.rep_)->str;
  len = strlen(__s);
  TiXmlString::assign(&pTVar1->value,__s,len);
  (pTVar1->super_TiXmlBase).userData = (this->super_TiXmlNode).super_TiXmlBase.userData;
  return pTVar1;
}

Assistant:

TiXmlNode* TiXmlUnknown::Clone() const {
	TiXmlUnknown* clone = new TiXmlUnknown();

	if (!clone)
		return 0;

	CopyTo(clone);
	return clone;
}